

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

GLint glcts::findMSBI(GLint input)

{
  undefined4 local_18;
  undefined4 local_14;
  GLuint result_1;
  GLuint result;
  GLint input_local;
  
  if ((input == 0) || (input == -1)) {
    result = 0xffffffff;
  }
  else {
    result_1 = input;
    if (input < 1) {
      local_18 = 0x1f;
      for (; (result_1 & 0x80000000) != 0; result_1 = result_1 << 1) {
        local_18 = local_18 - 1;
      }
      result = local_18;
    }
    else {
      local_14 = 0x1f;
      for (; (result_1 & 0x80000000) == 0; result_1 = result_1 << 1) {
        local_14 = local_14 - 1;
      }
      result = local_14;
    }
  }
  return result;
}

Assistant:

static GLint findMSBI(GLint input)
{
	if (input == 0 || input == -1)
	{
		return -1;
	}
	else if (input > 0)
	{
		for (GLuint result = 31;; --result)
		{
			if (input & 0x80000000)
			{
				return result;
			}
			input <<= 1;
		}
	}
	else
	{
		for (GLuint result = 31;; --result)
		{
			if (!(input & 0x80000000))
			{
				return result;
			}
			input <<= 1;
		}
	}
}